

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall trento::Proton::Proton(Proton *this)

{
  Nucleus::Nucleus(&this->super_Nucleus,1);
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_0012f9f8;
  return;
}

Assistant:

Proton::Proton() : Nucleus(1) {}